

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_retcode
csr_alloc_matrix(CUPDLPcsr *csr,cupdlp_int nRows,cupdlp_int nCols,void *src,
                CUPDLP_MATRIX_FORMAT src_matrix_format)

{
  undefined8 uVar1;
  cupdlp_int *__dest;
  cupdlp_int *__dest_00;
  cupdlp_float *__dest_01;
  int iVar2;
  cupdlp_retcode cVar3;
  cupdlp_retcode cVar4;
  
  if ((src_matrix_format == CSC) || (src_matrix_format == CSR)) {
    iVar2 = *(int *)((long)src + 8);
  }
  else {
    iVar2 = 0;
    if (src_matrix_format == DENSE) {
      iVar2 = nCols * nRows;
    }
  }
  __dest = (cupdlp_int *)calloc((long)(nRows + 1),4);
  csr->rowMatBeg = __dest;
  cVar4 = 1;
  if (__dest != (cupdlp_int *)0x0) {
    __dest_00 = (cupdlp_int *)calloc((long)iVar2,4);
    csr->rowMatIdx = __dest_00;
    if (__dest_00 != (cupdlp_int *)0x0) {
      __dest_01 = (cupdlp_float *)calloc((long)iVar2,8);
      csr->rowMatElem = __dest_01;
      if (__dest_01 != (cupdlp_float *)0x0) {
        cVar3 = 0;
        cVar4 = cVar3;
        if (src_matrix_format == CSC) {
          csc2csr(csr,(CUPDLPcsc *)src);
        }
        else if (src_matrix_format == CSR) {
          uVar1 = *src;
          csr->nRows = (int)uVar1;
          csr->nCols = (int)((ulong)uVar1 >> 0x20);
          iVar2 = *(int *)((long)src + 8);
          csr->nMatElem = iVar2;
          memcpy(__dest,*(void **)((long)src + 0x10),(long)(int)uVar1 * 4 + 4);
          memcpy(__dest_00,*(void **)((long)src + 0x18),(long)iVar2 * 4);
          memcpy(__dest_01,*(void **)((long)src + 0x20),(long)iVar2 << 3);
        }
        else {
          cVar4 = 0;
          if (src_matrix_format == DENSE) {
            dense2csr(csr,(CUPDLPdense *)src);
            cVar4 = cVar3;
          }
        }
      }
    }
  }
  return cVar4;
}

Assistant:

cupdlp_retcode csr_alloc_matrix(CUPDLPcsr *csr, cupdlp_int nRows,
                                cupdlp_int nCols, void *src,
                                CUPDLP_MATRIX_FORMAT src_matrix_format) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nnz = 0;
  switch (src_matrix_format) {
    case DENSE:
      nnz = nRows * nCols;
      break;
    case CSR:
      nnz = ((CUPDLPcsr *)src)->nMatElem;
      break;
    case CSC:
      nnz = ((CUPDLPcsc *)src)->nMatElem;
      break;
    default:
      break;
  }
  // todo make sure this is right
  cupdlp_init_zero_vec_int(csr->rowMatBeg, nRows + 1);
  cupdlp_init_zero_vec_int(csr->rowMatIdx, nnz);
  cupdlp_init_zero_vec_double(csr->rowMatElem, nnz);

  switch (src_matrix_format) {
    case DENSE:
      dense2csr(csr, (CUPDLPdense *)src);
      break;
    case CSR:
      csr_copy(csr, (CUPDLPcsr *)src);
      break;
    case CSC:
      csc2csr(csr, (CUPDLPcsc *)src);
      break;
    default:
      break;
  }
exit_cleanup:
  return retcode;
}